

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O0

string_view __thiscall
absl::lts_20250127::cord_internal::anon_unknown_0::
Consume<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
          (anon_unknown_0 *this,char *dst,string_view s,size_t n)

{
  size_type sVar1;
  const_pointer pvVar2;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  string_view sVar4;
  size_t offset;
  size_t n_local;
  char *dst_local;
  string_view s_local;
  
  s_local._M_len = s._M_len;
  dst_local = dst;
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&dst_local);
  sVar1 = sVar1 - (long)s._M_str;
  pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)&dst_local);
  memcpy(this,pvVar2 + sVar1,(size_t)s._M_str);
  bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                    ((basic_string_view<char,_std::char_traits<char>_> *)&dst_local,0,sVar1);
  sVar4._M_len = bVar3._M_len;
  sVar4._M_str = bVar3._M_str;
  return sVar4;
}

Assistant:

inline absl::string_view Consume(char* dst, absl::string_view s, size_t n) {
  if (edge_type == kBack) {
    memcpy(dst, s.data(), n);
    return s.substr(n);
  } else {
    const size_t offset = s.size() - n;
    memcpy(dst, s.data() + offset, n);
    return s.substr(0, offset);
  }
}